

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void emit_bin_op(c2m_ctx_t c2m_ctx,node_t_conflict r,type *type,op_t res,op_t op1,op_t op2)

{
  long lVar1;
  MIR_op_t mir_op;
  MIR_op_t op3;
  MIR_op_t op3_00;
  MIR_op_t op1_00;
  undefined8 uVar2;
  undefined8 uVar3;
  MIR_type_t t;
  MIR_insn_code_t code;
  node_t_conflict pnVar4;
  mir_size_t mVar5;
  MIR_op_t local_178;
  MIR_op_t local_148;
  op_t local_118;
  MIR_op_t local_d8;
  op_t local_a8;
  undefined1 local_68 [8];
  op_t temp;
  MIR_context_t ctx;
  type *type_local;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  temp.mir_op.u.mem.disp = (MIR_disp_t)c2m_ctx->ctx;
  if (type->mode == TM_PTR) {
    if ((((r->code != N_ADD) && (r->code != N_SUB)) && (r->code != N_ADD_ASSIGN)) &&
       (r->code != N_SUB_ASSIGN)) {
      __assert_fail("r->code == N_ADD || r->code == N_SUB || r->code == N_ADD_ASSIGN || r->code == N_SUB_ASSIGN"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2f0d,"void emit_bin_op(c2m_ctx_t, node_t, struct type *, op_t, op_t, op_t)");
    }
    pnVar4 = DLIST_node_t_head(&(r->u).ops);
    if (*(int *)(*(long *)((long)pnVar4->attr + 0x18) + 0x18) != 3) {
      memcpy(local_68,&op1,0x40);
      memcpy(&op1,&op2,0x40);
      memcpy(&op2,local_68,0x40);
    }
    uVar3 = temp.mir_op.u.mem.disp;
    if (((op2.mir_op._8_2_ & 0xff) == 3) || ((op2.mir_op._8_2_ & 0xff) == 4)) {
      uVar2 = op2.mir_op.u.i;
      mVar5 = type_size(c2m_ctx,(type->u).ptr_type);
      MIR_new_int_op(&local_d8,(MIR_context_t)uVar3,uVar2 * mVar5);
      mir_op._8_8_ = local_d8._8_8_;
      mir_op.data = local_d8.data;
      mir_op.u.i = local_d8.u.i;
      mir_op.u.str.s = local_d8.u.str.s;
      mir_op.u._16_8_ = local_d8.u._16_8_;
      mir_op.u.mem.disp = local_d8.u.mem.disp;
      new_op(&local_a8,(decl_t)0x0,mir_op);
      memcpy(&op2,&local_a8,0x40);
    }
    else {
      t = get_mir_type(c2m_ctx,type);
      get_new_temp(&local_118,c2m_ctx,t);
      memcpy(local_68,&local_118,0x40);
      uVar3 = temp.mir_op.u.mem.disp;
      mVar5 = type_size(c2m_ctx,(type->u).ptr_type);
      MIR_new_int_op(&local_148,(MIR_context_t)uVar3,mVar5);
      op1_00._8_8_ = temp.mir_op.data;
      op1_00.data = (void *)temp._8_8_;
      op1_00.u.i = temp.mir_op._8_8_;
      op1_00.u._8_8_ = temp.mir_op.u.i;
      op1_00.u._16_8_ = temp.mir_op.u.str.s;
      op1_00.u.mem.disp = temp.mir_op.u._16_8_;
      op3._8_8_ = local_148._8_8_;
      op3.data = local_148.data;
      op3.u.i = local_148.u.i;
      op3.u.str.s = local_148.u.str.s;
      op3.u._16_8_ = local_148.u._16_8_;
      op3.u.mem.disp = local_148.u.mem.disp;
      emit3(c2m_ctx,MIR_MUL,op1_00,op2.mir_op,op3);
      memcpy(&op2,local_68,0x40);
    }
  }
  code = get_mir_type_insn_code(c2m_ctx,type,r);
  emit3(c2m_ctx,code,res.mir_op,op1.mir_op,op2.mir_op);
  if (type->mode != TM_PTR) {
    pnVar4 = DLIST_node_t_head(&(r->u).ops);
    uVar3 = temp.mir_op.u.mem.disp;
    lVar1 = *(long *)((long)pnVar4->attr + 0x18);
    if (*(int *)(lVar1 + 0x18) == 3) {
      if ((r->code != N_SUB) && (r->code != N_SUB_ASSIGN)) {
        __assert_fail("r->code == N_SUB || r->code == N_SUB_ASSIGN",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2f1e,"void emit_bin_op(c2m_ctx_t, node_t, struct type *, op_t, op_t, op_t)"
                     );
      }
      mVar5 = type_size(c2m_ctx,*(type **)(lVar1 + 0x30));
      MIR_new_int_op(&local_178,(MIR_context_t)uVar3,mVar5);
      op3_00._8_8_ = local_178._8_8_;
      op3_00.data = local_178.data;
      op3_00.u.i = local_178.u.i;
      op3_00.u.str.s = local_178.u.str.s;
      op3_00.u._16_8_ = local_178.u._16_8_;
      op3_00.u.mem.disp = local_178.u.mem.disp;
      emit3(c2m_ctx,MIR_DIV,res.mir_op,res.mir_op,op3_00);
    }
  }
  return;
}

Assistant:

static void emit_bin_op (c2m_ctx_t c2m_ctx, node_t r, struct type *type, op_t res, op_t op1,
                         op_t op2) {
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t temp;

  if (type->mode == TM_PTR) { /* ptr +/- int */
    assert (r->code == N_ADD || r->code == N_SUB || r->code == N_ADD_ASSIGN
            || r->code == N_SUB_ASSIGN);
    if (((struct expr *) NL_HEAD (r->u.ops)->attr)->type->mode != TM_PTR) /* int + ptr */
      SWAP (op1, op2, temp);
    if (op2.mir_op.mode == MIR_OP_INT || op2.mir_op.mode == MIR_OP_UINT) {
      op2 = new_op (NULL,
                    MIR_new_int_op (ctx, op2.mir_op.u.i * type_size (c2m_ctx, type->u.ptr_type)));
    } else {
      temp = get_new_temp (c2m_ctx, get_mir_type (c2m_ctx, type));
      emit3 (c2m_ctx, sizeof (mir_size_t) == 8 ? MIR_MUL : MIR_MULS, temp.mir_op, op2.mir_op,
             MIR_new_int_op (ctx, type_size (c2m_ctx, type->u.ptr_type)));
      op2 = temp;
    }
  }
  emit3 (c2m_ctx, get_mir_type_insn_code (c2m_ctx, type, r), res.mir_op, op1.mir_op, op2.mir_op);
  if (type->mode != TM_PTR
      && (type = ((struct expr *) NL_HEAD (r->u.ops)->attr)->type)->mode
           == TM_PTR) { /* ptr - ptr */
    assert (r->code == N_SUB || r->code == N_SUB_ASSIGN);
    emit3 (c2m_ctx, sizeof (mir_size_t) == 8 ? MIR_DIV : MIR_DIVS, res.mir_op, res.mir_op,
           MIR_new_int_op (ctx, type_size (c2m_ctx, type->u.ptr_type)));
  }
}